

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O1

mat4 * dja::mat4::homogeneous::scale(float_t value)

{
  mat4 *in_RDI;
  
  in_RDI->m[0].x = 0.0;
  in_RDI->m[0].y = 0.0;
  in_RDI->m[0].z = 0.0;
  in_RDI->m[0].w = 0.0;
  in_RDI->m[1].x = 0.0;
  in_RDI->m[1].y = 0.0;
  in_RDI->m[1].z = 0.0;
  in_RDI->m[1].w = 0.0;
  in_RDI->m[2].x = 0.0;
  in_RDI->m[2].y = 0.0;
  in_RDI->m[2].z = 0.0;
  in_RDI->m[2].w = 0.0;
  in_RDI->m[3].x = 0.0;
  in_RDI->m[3].y = 0.0;
  in_RDI->m[3].z = 0.0;
  in_RDI->m[3].w = 0.0;
  in_RDI->m[0].x = value;
  in_RDI->m[0].y = 0.0;
  in_RDI->m[0].z = 0.0;
  *(undefined8 *)&in_RDI->m[0].w = 0;
  in_RDI->m[1].y = value;
  in_RDI->m[1].z = 0.0;
  in_RDI->m[1].w = 0.0;
  in_RDI->m[2].x = 0.0;
  in_RDI->m[2].y = 0.0;
  in_RDI->m[2].z = value;
  *(undefined8 *)&in_RDI->m[2].w = 0;
  in_RDI->m[3].y = 0.0;
  in_RDI->m[3].z = 0.0;
  in_RDI->m[3].w = 1.0;
  return in_RDI;
}

Assistant:

mat4 mat4::homogeneous::scale(float_t value)
{
    return mat4::homogeneous::from_mat3(mat3::scale(value));
}